

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

bool TestConstExpr::NotEqualTest<char,long_long>(void)

{
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs;
  bool bVar1;
  uint in_stack_ffffffffffffffc8;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar5;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffe7;
  
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<int>((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  bVar1 = ::operator!=(CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )(char)((uint)in_stack_ffffffffffffffd4 >> 0x18));
  uVar2 = in_stack_ffffffffffffffc8 & 0xffffff;
  uVar4 = uVar2;
  if (bVar1) {
    SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt<int>((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (int *)(CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8) &
                        0xffffffff00ffffff));
    bVar1 = ::operator!=((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          )(char)((uint)in_stack_ffffffffffffffd4 >> 0x18),
                         CONCAT44(in_stack_ffffffffffffffcc,uVar2));
    uVar3 = uVar2 & 0xffffff;
    uVar4 = uVar3;
    if (bVar1) {
      SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
      SafeInt<int>((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (int *)(CONCAT44(in_stack_ffffffffffffffcc,uVar2) & 0xffffffff00ffffff));
      uVar5 = 7;
      SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
      SafeInt<int>((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (int *)CONCAT44(in_stack_ffffffffffffffcc,uVar3));
      rhs.m_int._4_4_ = uVar5;
      rhs.m_int._0_4_ = in_stack_ffffffffffffffd8;
      bVar1 = ::operator!=(in_stack_ffffffffffffffe7,rhs);
      uVar2 = uVar3 & 0xffffff;
      uVar4 = uVar2;
      if (bVar1) {
        uVar5 = 1;
        SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
        SafeInt<int>((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT44(1,in_stack_ffffffffffffffd0),
                     (int *)(CONCAT44(in_stack_ffffffffffffffcc,uVar3) & 0xffffffff00ffffff));
        bVar1 = ::operator!=(false,(SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                                    )0x0);
        uVar4 = uVar2 & 0xffffff;
        if (bVar1) {
          SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
          SafeInt<int>((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(uVar5,in_stack_ffffffffffffffd0),(int *)(ulong)(uVar2 & 0xffffff)
                      );
          bVar1 = ::operator!=(false,(SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                                      )0x0);
          uVar4 = (uint)bVar1 << 0x18;
        }
      }
    }
  }
  return SUB41(uVar4 >> 0x18,0);
}

Assistant:

SAFEINT_CONSTEXPR11 bool NotEqualTest()
	{
		return
			(U)2 != SafeInt<T>(3) &&
			SafeInt<T>(4) != (U)5 &&
			SafeInt<T>(6) != SafeInt<U>(7) &&
			true != SafeInt<T>(1) &&
			false != SafeInt<T>(0);
	}